

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

int UpnpVirtualDir_set_GetInfoCallback(VDCallback_GetInfo callback)

{
  VDCallback_GetInfo p_Var1;
  int local_14;
  int ret;
  VDCallback_GetInfo callback_local;
  
  local_14 = 0;
  p_Var1 = callback;
  if (callback == (VDCallback_GetInfo)0x0) {
    local_14 = -0x65;
    p_Var1 = virtualDirCallback.get_info;
  }
  virtualDirCallback.get_info = p_Var1;
  return local_14;
}

Assistant:

int UpnpVirtualDir_set_GetInfoCallback(VDCallback_GetInfo callback)
{
	int ret = UPNP_E_SUCCESS;
	if (!callback) {
		ret = UPNP_E_INVALID_PARAM;
	} else {
		virtualDirCallback.get_info = callback;
	}

	return ret;
}